

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O0

void get_next(string *T,int *next)

{
  char cVar1;
  size_type sVar2;
  reference pvVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  int *next_local;
  string *T_local;
  
  local_1c = 1;
  local_20 = 0;
  next[1] = 0;
LAB_00103b4d:
  do {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (T);
    if (sVar2 <= (ulong)(long)local_1c) {
      printf("The next array is:");
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(T);
      printArray(next,(int)sVar2);
      return;
    }
    if (local_20 != 0) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](T,(long)local_1c);
      cVar1 = *pvVar3;
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](T,(long)local_20);
      if (cVar1 != *pvVar3) {
        local_20 = next[local_20];
        goto LAB_00103b4d;
      }
    }
    local_1c = local_1c + 1;
    local_20 = local_20 + 1;
    next[local_1c] = local_20;
  } while( true );
}

Assistant:

void get_next(string T, int next[])
{
    int i = 1, j = 0;
    next[1] = 0;
    while(i < T.length())
    {
        if(j==0 || T[i]==T[j])
        {
            ++i; ++j;
            next[i] = j;
        }
        else j = next[j];
    }
    printf("The next array is:");
    printArray(next,T.length());
}